

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

Quat rw::lerp(Quat *q,Quat *p,float32 r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Quat QVar5;
  Quat local_28;
  float32 local_18;
  
  local_28.x = q->x;
  local_28.y = q->y;
  local_28.z = q->z;
  local_28.w = q->w;
  fVar1 = (float)p->x;
  fVar2 = (float)p->y;
  fVar3 = (float)p->z;
  fVar4 = (float)p->w;
  if ((float)local_28.z * fVar3 +
      (float)local_28.y * fVar2 + (float)local_28.w * fVar4 + (float)local_28.x * fVar1 < 0.0) {
    local_18 = r;
    QVar5 = negate(&local_28);
    local_28.x = QVar5.x;
    local_28.y = QVar5.y;
    fVar1 = (float)p->x;
    fVar2 = (float)p->y;
    fVar3 = (float)p->z;
    fVar4 = (float)p->w;
    local_28.z = QVar5.z;
    local_28.w = QVar5.w;
    r = local_18;
  }
  QVar5.w = (float32)((float)r * (fVar4 - (float)local_28.w) + (float)local_28.w);
  QVar5.z = (float32)((float)r * (fVar3 - (float)local_28.z) + (float)local_28.z);
  QVar5.y = (float32)((float)r * (fVar2 - (float)local_28.y) + (float)local_28.y);
  QVar5.x = (float32)((float)r * (fVar1 - (float)local_28.x) + (float)local_28.x);
  return QVar5;
}

Assistant:

Quat
lerp(const Quat &q, const Quat &p, float32 r)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	return makeQuat(q1.w + r*(p.w - q1.w),
	                q1.x + r*(p.x - q1.x),
	                q1.y + r*(p.y - q1.y),
	                q1.z + r*(p.z - q1.z));
}